

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O1

void __thiscall
NshCmdArrayRegister_SuccessMaxElements_Test::TestBody
          (NshCmdArrayRegister_SuccessMaxElements_Test *this)

{
  nsh_status_t nVar1;
  nsh_cmd_array_t *lhs;
  char *pcVar2;
  long lVar3;
  AssertionResult gtest_ar;
  nsh_cmd_array_t cmds;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_358;
  AssertHelper local_350;
  internal local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  nsh_cmd_array_t local_338;
  
  local_358._M_head_impl._0_4_ = nsh_cmd_array_init(&local_338);
  local_350.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<nsh_status,nsh_status>
            (local_348,"nsh_cmd_array_init(&cmds)","NSH_STATUS_OK",(nsh_status *)&local_358,
             (nsh_status *)&local_350);
  if (local_348[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_358);
    if (local_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_340->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_358);
LAB_0011647f:
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_358._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_358._M_head_impl + 8))();
    }
    if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_340,local_340);
    }
  }
  else {
    if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_340,local_340);
    }
    lVar3 = -0x20;
    lhs = &local_338;
    do {
      nVar1 = nsh_cmd_array_register(&local_338,"test",cmd_test_handler);
      local_358._M_head_impl._0_4_ = nVar1;
      local_350.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<nsh_status,nsh_status>
                (local_348,"nsh_cmd_array_register(&cmds, cmd_test_name, &cmd_test_handler)",
                 "NSH_STATUS_OK",(nsh_status *)&local_358,(nsh_status *)&local_350);
      if (local_348[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_358);
        if (local_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_340->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_350,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x2e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_358);
        goto LAB_0011647f;
      }
      if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_340,local_340);
      }
      local_358._M_head_impl._0_4_ = (int)lVar3 + 0x21;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_348,"cmds.count","i + 1",&local_338.count,(uint *)&local_358);
      if (local_348[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_358);
        if (local_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_340->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_350,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x2f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_358);
        goto LAB_0011647f;
      }
      if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_340,local_340);
      }
      testing::internal::CmpHelperSTREQ
                (local_348,"cmds.array[i].name","cmd_test_name",lhs->array[0].name,"test");
      if (local_348[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_358);
        if (local_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_340->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_350,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x30,pcVar2);
        testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_358);
        goto LAB_0011647f;
      }
      if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_340,local_340);
      }
      local_358._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmd_test_handler;
      testing::internal::
      CmpHelperEQ<nsh_status(*)(unsigned_int,char**),nsh_status(*)(unsigned_int,char**)>
                (local_348,"cmds.array[i].handler","&cmd_test_handler",
                 (_func_nsh_status_uint_char_ptr_ptr **)lhs,
                 (_func_nsh_status_uint_char_ptr_ptr **)&local_358);
      if (local_348[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_358);
        if (local_340 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = (local_340->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_350,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_cmd_array.cpp"
                   ,0x31,pcVar2);
        testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_358);
        goto LAB_0011647f;
      }
      if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_340,local_340);
      }
      lhs = (nsh_cmd_array_t *)(lhs->array + 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

TEST(NshCmdArrayRegister, SuccessMaxElements)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    for (auto i = 0u; i < NSH_CMD_MAX_COUNT; i++) {
        ASSERT_EQ(nsh_cmd_array_register(&cmds, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);
        ASSERT_EQ(cmds.count, i + 1);
        ASSERT_STREQ(cmds.array[i].name, cmd_test_name);
        ASSERT_EQ(cmds.array[i].handler, &cmd_test_handler);
    }
}